

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

void Abc_NtkTrasferNames(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew)

{
  long *plVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  long *plVar6;
  long lVar7;
  
  if (pNtk->vPis->nSize != pNtkNew->vPis->nSize) {
    __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x90,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != pNtkNew->vPos->nSize) {
    __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x91,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vBoxes->nSize != pNtkNew->vBoxes->nSize) {
    __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkBoxNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x92,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar3 = Nm_ManNumEntries(pNtk->pManName);
  if (0 < iVar3) {
    iVar3 = Nm_ManNumEntries(pNtkNew->pManName);
    if (iVar3 == 0) {
      pVVar5 = pNtk->vCis;
      if (0 < pVVar5->nSize) {
        lVar7 = 0;
        do {
          plVar1 = (long *)pVVar5->pArray[lVar7];
          plVar6 = plVar1;
          if (*(int *)*plVar1 == 1) {
            plVar6 = *(long **)(*(long *)(*(long *)((int *)*plVar1 + 8) + 8) +
                               (long)*(int *)plVar1[6] * 8);
          }
          pAVar2 = (Abc_Obj_t *)plVar1[8];
          pcVar4 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar6 + 0x18),(int)plVar6[2]);
          Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
          lVar7 = lVar7 + 1;
          pVVar5 = pNtk->vCis;
        } while (lVar7 < pVVar5->nSize);
      }
      pVVar5 = pNtk->vCos;
      if (0 < pVVar5->nSize) {
        lVar7 = 0;
        do {
          plVar1 = (long *)pVVar5->pArray[lVar7];
          plVar6 = plVar1;
          if (*(int *)*plVar1 == 1) {
            plVar6 = *(long **)(*(long *)(*(long *)((int *)*plVar1 + 8) + 8) +
                               (long)*(int *)plVar1[4] * 8);
          }
          pAVar2 = (Abc_Obj_t *)plVar1[8];
          pcVar4 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar6 + 0x18),(int)plVar6[2]);
          Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
          lVar7 = lVar7 + 1;
          pVVar5 = pNtk->vCos;
        } while (lVar7 < pVVar5->nSize);
      }
      pVVar5 = pNtk->vBoxes;
      if (0 < pVVar5->nSize) {
        lVar7 = 0;
        do {
          plVar1 = (long *)pVVar5->pArray[lVar7];
          pAVar2 = (Abc_Obj_t *)plVar1[8];
          pcVar4 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
          Abc_ObjAssignName(pAVar2,pcVar4,(char *)0x0);
          lVar7 = lVar7 + 1;
          pVVar5 = pNtk->vBoxes;
        } while (lVar7 < pVVar5->nSize);
      }
      return;
    }
    __assert_fail("Nm_ManNumEntries(pNtkNew->pManName) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                  ,0x94,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Nm_ManNumEntries(pNtk->pManName) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNames.c"
                ,0x93,"void Abc_NtkTrasferNames(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTrasferNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkBoxNum(pNtk) == Abc_NtkBoxNum(pNtkNew) );
    assert( Nm_ManNumEntries(pNtk->pManName) > 0 );
    assert( Nm_ManNumEntries(pNtkNew->pManName) == 0 );
    // copy the CI/CO/box names
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanout0Ntk(pObj)), NULL );
    Abc_NtkForEachCo( pNtk, pObj, i ) 
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(Abc_ObjFanin0Ntk(pObj)), NULL );
    Abc_NtkForEachBox( pNtk, pObj, i ) 
        Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
}